

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::LocationValidator::validateSingleVariable
          (LocationValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  pointer pVVar2;
  long lVar3;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *pvVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  InterfaceBlock *pIVar7;
  Storage SVar8;
  VarType *type;
  MessageBuilder *this_01;
  long lVar9;
  int memberNdx;
  Storage SVar10;
  long lVar11;
  string *psVar12;
  bool bVar13;
  bool bVar14;
  int local_284;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *local_280;
  long local_278;
  PropValidator *local_270;
  string *local_268;
  pointer local_260;
  int local_254;
  string arrayResourceName;
  string elementResourceName;
  string reasonStr;
  string local_1f0;
  MessageBuilder local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (((path->
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1].m_data.block)->layout).offset;
  local_280 = path;
  if (pVVar2->m_type == TYPE_INTERFACEBLOCK) {
    pIVar7 = (pVVar2->m_data).block;
    SVar10 = pIVar7->storage;
    iVar6 = *(int *)&(this->super_SingleVariableValidator).super_PropValidator.field_0x2c;
    bVar13 = iVar6 != 1;
    type = (VarType *)CONCAT71((int7)((ulong)path >> 8),bVar13);
    bVar14 = iVar6 != 2;
    local_268 = implementationName;
    if (STORAGE_PATCH_OUT < SVar10) {
LAB_005144e3:
      pIVar7 = pVVar2[1].m_data.block;
      SVar8 = pIVar7->memoryAccessQualifierFlags;
      goto LAB_00514090;
    }
    if ((99U >> (SVar10 & 0x1f) & 1) != 0) {
      local_278 = CONCAT71(local_278._1_7_,bVar13);
      local_260 = (pointer)CONCAT44(local_260._4_4_,SVar10);
      iVar6 = (pIVar7->layout).location;
      lVar9 = 0;
      local_270 = (PropValidator *)this;
      local_254 = iVar5;
      for (lVar11 = 0;
          lVar3 = *(long *)&(pIVar7->variables).
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl,
          lVar11 < (int)(((long)(pIVar7->variables).
                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                ._M_impl.super__Vector_impl_data._M_finish - lVar3) / 0x60);
          lVar11 = lVar11 + 1) {
        if (*(int *)(lVar3 + lVar9) != -1) {
          iVar6 = *(int *)(lVar3 + lVar9);
        }
        if ((VarType *)(lVar3 + lVar9) ==
            (local_280->
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            )._M_impl.super__Vector_impl_data._M_start[1].m_data.type) break;
        iVar5 = -1;
        if (iVar6 != -1) {
          iVar5 = getVariableLocationLength((anon_unknown_0 *)(lVar3 + lVar9 + 0x20),type);
          iVar5 = iVar5 + iVar6;
        }
        iVar6 = iVar5;
        lVar9 = lVar9 + 0x60;
      }
      iVar6 = getIOSubVariableLocation(local_280,2,iVar6);
      this = (LocationValidator *)local_270;
      implementationName = local_268;
      iVar5 = local_254;
      SVar10 = (Storage)local_260;
      goto LAB_005140e3;
    }
    if (SVar10 != STORAGE_UNIFORM) goto LAB_005144e3;
LAB_0051428a:
    reasonStr._M_dataplus._M_p = (pointer)&reasonStr.field_2;
    reasonStr.field_2._M_local_buf[0] = '\0';
    reasonStr._M_string_length = 0;
    std::__cxx11::string::assign((char *)&reasonStr);
    local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
    poVar1 = &local_1d0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying uniform location, expecting -1. (");
    std::operator<<((ostream *)poVar1,(string *)&reasonStr);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (propValue == -1) goto LAB_00514391;
    local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
    poVar1 = &local_1d0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"resource location invalid",
               (allocator<char> *)&arrayResourceName);
    PropValidator::setError((PropValidator *)this,(string *)&local_1d0);
LAB_00514384:
    this_01 = &local_1d0;
  }
  else {
    iVar6 = *(int *)&(this->super_SingleVariableValidator).super_PropValidator.field_0x2c;
    bVar13 = iVar6 != 1;
    bVar14 = iVar6 != 2;
    pIVar7 = (pVVar2->m_data).block;
    SVar10 = pIVar7->memoryAccessQualifierFlags;
    SVar8 = SVar10;
LAB_00514090:
    local_278 = CONCAT71(local_278._1_7_,bVar13);
    iVar6 = -1;
    if (SVar8 < STORAGE_LAST) {
      if ((99U >> (SVar8 & 0x1f) & 1) == 0) {
        if (SVar8 == STORAGE_UNIFORM) {
          iVar6 = (pIVar7->layout).location;
        }
      }
      else {
        iVar6 = getIOSubVariableLocation(path,1,(pIVar7->layout).location);
      }
    }
LAB_005140e3:
    reasonStr._M_dataplus._M_p = (pointer)&reasonStr.field_2;
    reasonStr._M_string_length = 0;
    reasonStr.field_2._M_local_buf[0] = '\0';
    if (iVar5 == 0x54) goto LAB_0051428a;
    switch((ulong)SVar10) {
    case 0:
    case 5:
      if ((((byte)local_278 & iVar6 == -1) != 0) ||
         (((bool)(SVar10 == STORAGE_OUT & bVar14) && (iVar6 == -1)))) goto LAB_0051428a;
      break;
    case 1:
    case 6:
      if ((bool)(bVar14 & iVar6 == -1)) goto LAB_0051428a;
    }
    if (iVar6 != -1) {
      local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
      poVar1 = &local_1d0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Verifying location, expecting ");
      std::ostream::operator<<(poVar1,iVar6);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      if (iVar6 == propValue) goto LAB_00514403;
LAB_005141b6:
      local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
      poVar1 = &local_1d0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"\tError, got ");
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"resource location invalid",
                 (allocator<char> *)&arrayResourceName);
      PropValidator::setError((PropValidator *)this,(string *)&local_1d0);
      goto LAB_00514384;
    }
    local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
    poVar1 = &local_1d0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying location, expecting a valid location");
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (propValue == -1) goto LAB_005141b6;
LAB_00514403:
    pVVar2 = (local_280->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar12 = (string *)
              ((long)(local_280->
                     super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2);
    if ((psVar12 < (string *)0x11) || (*(int *)((long)&pVVar2[-2].m_type + (long)psVar12) != 0)) {
      bVar14 = false;
    }
    else {
      bVar14 = **(int **)((long)&psVar12[-1]._M_dataplus._M_p + (long)pVVar2) == 1;
    }
    iVar5 = (*((PropValidator *)this)->m_renderContext->_vptr_RenderContext[3])();
    pvVar4 = local_280;
    local_278 = CONCAT44(extraout_var,iVar5);
    local_280 = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 *)((ulong)local_280 & 0xffffffff00000000);
    if (SVar10 < STORAGE_LAST) {
      local_280 = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                   *)CONCAT44(SUB84(pvVar4,4),*(undefined4 *)(&DAT_00833230 + (ulong)SVar10 * 4));
    }
    local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
    poVar1 = &local_1d0.m_str;
    local_268 = psVar12;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Comparing location to the values returned by GetProgramResourceLocation");
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (!bVar14) {
      iVar5 = (**(code **)(local_278 + 0x9b0))
                        (*(undefined4 *)
                          ((long)&((PropValidator *)((long)this + 0x30))->_vptr_PropValidator + 4),
                         (ulong)local_280 & 0xffffffff,(implementationName->_M_dataplus)._M_p);
      if (iVar5 == propValue) goto LAB_00514391;
      local_1d0.m_log = ((PropValidator *)this)->m_testCtx->m_log;
      poVar1 = &local_1d0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"\tError, getProgramResourceLocation returned location ");
      std::ostream::operator<<(poVar1,iVar5);
      std::operator<<((ostream *)poVar1,", expected ");
      std::ostream::operator<<(poVar1,propValue);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"resource location invalid",
                 (allocator<char> *)&arrayResourceName);
      PropValidator::setError((PropValidator *)this,(string *)&local_1d0);
      goto LAB_00514384;
    }
    local_270 = (PropValidator *)this;
    local_260 = pVVar2;
    if (implementationName->_M_string_length < 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arrayResourceName,SSBOArrayLengthTests::init::arraysSized + 1,
                 (allocator<char> *)&local_1d0);
    }
    else {
      std::__cxx11::string::substr((ulong)&arrayResourceName,(ulong)implementationName);
    }
    poVar1 = &local_1d0.m_str;
    for (local_284 = 0;
        local_284 <
        *(int *)(*(long *)((long)&local_268[-1]._M_dataplus._M_p + (long)local_260) + 0x10);
        local_284 = local_284 + 1) {
      std::operator+(&local_50,&arrayResourceName,"[");
      de::toString<int>(&local_1f0,&local_284);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0
                     ,&local_50,&local_1f0);
      std::operator+(&elementResourceName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0
                     ,"]");
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_50);
      iVar5 = (**(code **)(local_278 + 0x9b0))
                        (*(undefined4 *)((long)&local_270[1]._vptr_PropValidator + 4),
                         (ulong)local_280 & 0xffffffff,elementResourceName._M_dataplus._M_p);
      if (iVar5 == local_284 + propValue) {
        local_1d0.m_log = local_270->m_testCtx->m_log;
        this_00 = &local_1d0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"\tLocation of \"");
        std::operator<<((ostream *)this_00,(string *)&elementResourceName);
        std::operator<<((ostream *)this_00,"\":\t");
        std::ostream::operator<<(this_00,iVar5);
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
      else {
        local_1d0.m_log = local_270->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"\tError, getProgramResourceLocation (resource=\"");
        std::operator<<((ostream *)poVar1,(string *)&elementResourceName);
        std::operator<<((ostream *)poVar1,"\") returned location ");
        std::ostream::operator<<(poVar1,iVar5);
        std::operator<<((ostream *)poVar1,", expected ");
        std::ostream::operator<<(poVar1,local_284 + propValue);
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"resource location invalid",(allocator<char> *)&local_50);
        PropValidator::setError(local_270,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      std::__cxx11::string::~string((string *)&elementResourceName);
    }
    this_01 = (MessageBuilder *)&arrayResourceName;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00514391:
  std::__cxx11::string::~string((string *)&reasonStr);
  return;
}

Assistant:

void LocationValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const bool			isAtomicCounterUniform	= glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType());
	const bool			isUniformBlockVariable	= path.front().isInterfaceBlock() && path.front().getInterfaceBlock()->storage == glu::STORAGE_UNIFORM;
	const bool			isVertexShader			= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_VERTEX);
	const bool			isFragmentShader		= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_FRAGMENT);
	const glu::Storage	storage					= (path.front().isInterfaceBlock()) ? (path.front().getInterfaceBlock()->storage) : (path.front().getDeclaration()->storage);
	const bool			isInputVariable			= (storage == glu::STORAGE_IN || storage == glu::STORAGE_PATCH_IN);
	const bool			isOutputVariable		= (storage == glu::STORAGE_OUT || storage == glu::STORAGE_PATCH_OUT);
	const int			explicitLayoutLocation	= getExplicitLocationFromPath(path);

	bool				expectLocation;
	std::string			reasonStr;

	DE_UNREF(resource);

	if (isAtomicCounterUniform)
	{
		expectLocation = false;
		reasonStr = "Atomic counter uniforms have effective location of -1";
	}
	else if (isUniformBlockVariable)
	{
		expectLocation = false;
		reasonStr = "Uniform block variables have effective location of -1";
	}
	else if (isInputVariable && !isVertexShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Inputs (except for vertex shader inputs) not declared with a location layout qualifier have effective location of -1";
	}
	else if (isOutputVariable && !isFragmentShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Outputs (except for fragment shader outputs) not declared with a location layout qualifier have effective location of -1";
	}
	else
	{
		expectLocation = true;
	}

	if (!expectLocation)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform location, expecting -1. (" << reasonStr << ")" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
	}
	else
	{
		bool locationOk;

		if (explicitLayoutLocation == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting a valid location" << tcu::TestLog::EndMessage;
			locationOk = (propValue != -1);
		}
		else
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting " << explicitLayoutLocation << tcu::TestLog::EndMessage;
			locationOk = (propValue == explicitLayoutLocation);
		}

		if (!locationOk)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
		else
		{
			const VariablePathComponent		nullComponent;
			const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
			const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();

			const glw::Functions&			gl					= m_renderContext.getFunctions();
			const glw::GLenum				interface			= getProgramDefaultBlockInterfaceFromStorage(storage);

			m_testCtx.getLog() << tcu::TestLog::Message << "Comparing location to the values returned by GetProgramResourceLocation" << tcu::TestLog::EndMessage;

			// Test all bottom-level array elements
			if (isArray)
			{
				const std::string arrayResourceName = (implementationName.size() > 3) ? (implementationName.substr(0, implementationName.size() - 3)) : (""); // chop "[0]"

				for (int arrayElementNdx = 0; arrayElementNdx < enclosingcomponent.getVariableType()->getArraySize(); ++arrayElementNdx)
				{
					const std::string	elementResourceName	= arrayResourceName + "[" + de::toString(arrayElementNdx) + "]";
					const glw::GLint	location			= gl.getProgramResourceLocation(m_programID, interface, elementResourceName.c_str());

					if (location != propValue+arrayElementNdx)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tError, getProgramResourceLocation (resource=\"" << elementResourceName << "\") returned location " << location
							<< ", expected " << (propValue+arrayElementNdx)
							<< tcu::TestLog::EndMessage;
						setError("resource location invalid");
					}
					else
						m_testCtx.getLog() << tcu::TestLog::Message << "\tLocation of \"" << elementResourceName << "\":\t" << location << tcu::TestLog::EndMessage;
				}
			}
			else
			{
				const glw::GLint location = gl.getProgramResourceLocation(m_programID, interface, implementationName.c_str());

				if (location != propValue)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "\tError, getProgramResourceLocation returned location " << location << ", expected " << propValue << tcu::TestLog::EndMessage;
					setError("resource location invalid");
				}
			}

		}
	}
}